

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_key_encode_decode.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_8b1c::ARTKeyEncodeDecodeTest_DoubleC0005SignalingNan_Test::TestBody
          (ARTKeyEncodeDecodeTest_DoubleC0005SignalingNan_Test *this)

{
  do_encode_decode_double_test(NAN);
  return;
}

Assistant:

UNODB_TEST(ARTKeyEncodeDecodeTest, DoubleC0005SignalingNan) {
  using F = double;
  constexpr F f{std::numeric_limits<F>::signaling_NaN()};
  UNODB_EXPECT_TRUE(std::isnan(f));
  do_encode_decode_double_test(f);
}